

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O0

void background_work_sleep_once(tsdn_t *tsdn,background_thread_info_t *info,uint ind)

{
  uint uVar1;
  arena_t *tsdn_00;
  uint in_EDX;
  tsdn_t *in_RSI;
  uint64_t interval;
  arena_t *arena;
  uint i;
  uint narenas;
  uint64_t min_interval;
  uint64_t in_stack_00000050;
  background_thread_info_t *in_stack_00000058;
  tsdn_t *in_stack_00000060;
  arena_t *in_stack_ffffffffffffffc8;
  uint local_28;
  arena_t *arena_00;
  undefined4 in_stack_ffffffffffffffe8;
  uint ind_00;
  
  arena_00 = (arena_t *)0xffffffffffffffff;
  local_28 = in_EDX;
  uVar1 = narenas_total_get();
  ind_00 = local_28;
  for (; local_28 < uVar1; local_28 = local_28 + (int)max_background_threads) {
    tsdn_00 = arena_get(in_RSI,ind_00,SUB41((uint)in_stack_ffffffffffffffe8 >> 0x18,0));
    if (((tsdn_00 != (arena_t *)0x0) &&
        (arena_decay((tsdn_t *)tsdn_00,in_stack_ffffffffffffffc8,false,false),
        arena_00 != (arena_t *)0x5f5e100)) &&
       (in_stack_ffffffffffffffc8 =
             (arena_t *)
             arena_decay_compute_purge_interval
                       ((tsdn_t *)CONCAT44(ind_00,in_stack_ffffffffffffffe8),arena_00),
       in_stack_ffffffffffffffc8 < arena_00)) {
      arena_00 = in_stack_ffffffffffffffc8;
    }
  }
  background_thread_sleep(in_stack_00000060,in_stack_00000058,in_stack_00000050);
  return;
}

Assistant:

static inline void
background_work_sleep_once(tsdn_t *tsdn, background_thread_info_t *info, unsigned ind) {
	uint64_t min_interval = BACKGROUND_THREAD_INDEFINITE_SLEEP;
	unsigned narenas = narenas_total_get();

	for (unsigned i = ind; i < narenas; i += max_background_threads) {
		arena_t *arena = arena_get(tsdn, i, false);
		if (!arena) {
			continue;
		}
		arena_decay(tsdn, arena, true, false);
		if (min_interval == BACKGROUND_THREAD_MIN_INTERVAL_NS) {
			/* Min interval will be used. */
			continue;
		}
		uint64_t interval = arena_decay_compute_purge_interval(tsdn,
		    arena);
		assert(interval >= BACKGROUND_THREAD_MIN_INTERVAL_NS);
		if (min_interval > interval) {
			min_interval = interval;
		}
	}
	background_thread_sleep(tsdn, info, min_interval);
}